

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_resize.cpp
# Opt level: O2

void checkWindowSize(GLFWwindow *window,int width,int height,bool fatal)

{
  undefined8 in_RAX;
  ostream *poVar1;
  char *pcVar2;
  int h;
  int w;
  
  _h = in_RAX;
  glfwGetWindowSize(window,&w,&h);
  if ((w != width) || (h != height)) {
    pcVar2 = "warning";
    if (fatal) {
      pcVar2 = "error";
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"expected window size ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,width);
    poVar1 = std::operator<<(poVar1,"x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,height);
    poVar1 = std::operator<<(poVar1,", but got ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,w);
    poVar1 = std::operator<<(poVar1,"x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,h);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (fatal) {
      exit(1);
    }
  }
  return;
}

Assistant:

static void
checkWindowSize(GLFWwindow* window, int width, int height, bool fatal)
{
    int w, h;
    glfwGetWindowSize(window, &w, &h);
    if (w == width && h == height) {
        return;
    }
    std::cerr << (fatal ? "error" : "warning") << ": "
              << "expected window size " << width << "x" << height
              << ", but got " << w << "x" << h << std::endl;
    if (fatal) {
        exit(EXIT_FAILURE);
    }
}